

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O1

string * __thiscall
cmsys::SystemInformationImplementation::ExtractValueFromSysCtl_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,char *word)

{
  ulong uVar1;
  long lVar2;
  string *psVar3;
  
  psVar3 = &this->SysCtlBuffer;
  strlen(word);
  uVar1 = std::__cxx11::string::find((char *)psVar3,(ulong)word,0);
  if (uVar1 != 0xffffffffffffffff) {
    uVar1 = std::__cxx11::string::find((char *)psVar3,0x5d1886,uVar1);
    lVar2 = std::__cxx11::string::find((char *)psVar3,0x60b1f9,uVar1);
    if (lVar2 != -1 && uVar1 != 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)psVar3);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformationImplementation::ExtractValueFromSysCtl(
  const char* word)
{
  size_t pos = this->SysCtlBuffer.find(word);
  if (pos != std::string::npos) {
    pos = this->SysCtlBuffer.find(": ", pos);
    size_t pos2 = this->SysCtlBuffer.find("\n", pos);
    if (pos != std::string::npos && pos2 != std::string::npos) {
      return this->SysCtlBuffer.substr(pos + 2, pos2 - pos - 2);
    }
  }
  return "";
}